

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,float,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  value_type vVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  const_reference pvVar7;
  sel_t *psVar8;
  ulong uVar9;
  idx_t iVar10;
  SelectionVector *pSVar11;
  idx_t iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  idx_t iVar16;
  idx_t iVar17;
  bool bVar18;
  float *lhs_data;
  float local_50;
  float local_4c;
  idx_t local_48;
  ulong local_40;
  data_ptr_t local_38;
  
  local_40 = col_idx >> 3;
  local_48 = count;
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar6 = rhs_row_locations->data;
    pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar3 = *pvVar7;
      iVar16 = 0;
      uVar13 = 0;
      do {
        uVar14 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)sel->sel_vector[uVar13];
        }
        psVar8 = pSVar2->sel_vector;
        uVar9 = uVar14;
        if (psVar8 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar8[uVar14];
        }
        local_50 = *(float *)(*(long *)(pdVar6 + uVar14 * 8) + vVar3);
        if (((1 << ((byte)col_idx & 7) & (uint)*(byte *)(*(long *)(pdVar6 + uVar14 * 8) + local_40))
             == 0) ||
           (bVar18 = Equals::Operation<float>((float *)(pdVar1 + uVar9 * 4),&local_50),
           count = local_48, !bVar18)) {
          iVar17 = *no_match_count;
          *no_match_count = iVar17 + 1;
          pSVar11 = no_match_sel;
        }
        else {
          iVar17 = iVar16;
          pSVar11 = sel;
          iVar16 = iVar16 + 1;
        }
        pSVar11->sel_vector[iVar17] = (sel_t)uVar14;
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
      return iVar16;
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    local_38 = (lhs_format->unified).data;
    pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar3 = *pvVar7;
      iVar17 = 0;
      iVar16 = 0;
      do {
        psVar8 = sel->sel_vector;
        iVar12 = iVar16;
        if (psVar8 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar8[iVar16];
        }
        psVar4 = pSVar2->sel_vector;
        iVar10 = iVar12;
        if (psVar4 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar4[iVar12];
        }
        puVar5 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar18 = false;
        }
        else {
          bVar18 = (puVar5[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0;
        }
        uVar15 = (uint)*(byte *)(*(long *)(pdVar1 + iVar12 * 8) + local_40) &
                 1 << ((byte)col_idx & 7);
        local_4c = *(float *)(*(long *)(pdVar1 + iVar12 * 8) + vVar3);
        if ((bVar18 == false) && (uVar15 != 0)) {
          bVar18 = Equals::Operation<float>((float *)(local_38 + iVar10 * 4),&local_4c);
          count = local_48;
          if (bVar18) {
            psVar8 = sel->sel_vector;
            goto LAB_01290021;
          }
LAB_0128ffff:
          iVar10 = *no_match_count;
          *no_match_count = iVar10 + 1;
          no_match_sel->sel_vector[iVar10] = (sel_t)iVar12;
        }
        else {
          if (bVar18 != (uVar15 == 0)) goto LAB_0128ffff;
LAB_01290021:
          psVar8[iVar17] = (sel_t)iVar12;
          iVar17 = iVar17 + 1;
        }
        iVar16 = iVar16 + 1;
        if (count == iVar16) {
          return iVar17;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}